

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall
Assimp::IFC::Schema_2x3::IfcCartesianTransformationOperator3DnonUniform::
IfcCartesianTransformationOperator3DnonUniform(IfcCartesianTransformationOperator3DnonUniform *this)

{
  *(undefined ***)&this->field_0xb8 = &PTR__Object_007a99b0;
  *(undefined8 *)&this->field_0xc0 = 0;
  *(char **)&this->field_0xc8 = "IfcCartesianTransformationOperator3DnonUniform";
  IfcCartesianTransformationOperator3D::IfcCartesianTransformationOperator3D
            (&this->super_IfcCartesianTransformationOperator3D,&PTR_construction_vtable_24__0081ccf8
            );
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator3D).field_0x90 = 0;
  (this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
  super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x81cc18;
  *(undefined8 *)&this->field_0xb8 = 0x81cce0;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x81cc40;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0x81cc68;
  *(undefined8 *)
   &(this->super_IfcCartesianTransformationOperator3D).super_IfcCartesianTransformationOperator.
    field_0x68 = 0x81cc90;
  *(undefined8 *)&(this->super_IfcCartesianTransformationOperator3D).field_0x88 = 0x81ccb8;
  this->field_0xa0 = 0;
  (this->Scale3).have = false;
  return;
}

Assistant:

IfcCartesianTransformationOperator3DnonUniform() : Object("IfcCartesianTransformationOperator3DnonUniform") {}